

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.h
# Opt level: O1

void __thiscall chatra::Reference::setWithoutBothLock(Reference *this,Reference *ref)

{
  SpinLock *pSVar1;
  iterator *piVar2;
  __atomic_flag_data_type _Var3;
  anon_union_8_4_9b5272a9_for_ReferenceNode_3 aVar4;
  bool bVar5;
  ReferenceNode *pRVar6;
  ReferenceNode *pRVar7;
  Storage *pSVar8;
  Storage *pSVar9;
  _Elt_pointer ppOVar10;
  Object *local_18;
  
  pRVar6 = ref->node;
  switch(pRVar6->type) {
  case Bool:
    pRVar7 = this->node;
    bVar5 = (pRVar6->field_3).vBool;
    pRVar7->type = Bool;
    pRVar7->object = (Object *)0x0;
    (pRVar7->field_3).vBool = bVar5;
    break;
  case Int:
    pRVar7 = this->node;
    aVar4 = pRVar6->field_3;
    pRVar7->type = Int;
    pRVar7->object = (Object *)0x0;
    pRVar7->field_3 = aVar4;
    break;
  case Float:
    pRVar7 = this->node;
    aVar4 = pRVar6->field_3;
    pRVar7->type = Float;
    pRVar7->object = (Object *)0x0;
    pRVar7->field_3 = aVar4;
    break;
  case Object:
    pRVar7 = this->node;
    local_18 = pRVar6->object;
    pRVar7->type = Object;
    pRVar7->object = local_18;
    if (((local_18 != (Object *)0x0) && (((pRVar7->group->storage->marking)._M_base._M_i & 1U) != 0)
        ) && (local_18->gcGeneration !=
              (pRVar7->group->storage->gcGeneration).super___atomic_base<unsigned_int>._M_i)) {
      pSVar8 = pRVar7->group->storage;
      do {
        LOCK();
        pSVar1 = &pSVar8->lockGcTargets;
        _Var3 = (pSVar1->flag).super___atomic_flag_base._M_i;
        (pSVar1->flag).super___atomic_flag_base._M_i = true;
        UNLOCK();
      } while (_Var3 != false);
      pSVar9 = pRVar7->group->storage;
      ppOVar10 = (pSVar9->gcTargets).
                 super__Deque_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
      if (ppOVar10 ==
          (pSVar9->gcTargets).super__Deque_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<chatra::Object*,std::allocator<chatra::Object*>>::
        _M_push_back_aux<chatra::Object*const&>
                  ((deque<chatra::Object*,std::allocator<chatra::Object*>> *)&pSVar9->gcTargets,
                   &local_18);
      }
      else {
        *ppOVar10 = local_18;
        piVar2 = &(pSVar9->gcTargets).
                  super__Deque_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
                  super__Deque_impl_data._M_finish;
        piVar2->_M_cur = piVar2->_M_cur + 1;
      }
      (pSVar8->lockGcTargets).flag.super___atomic_flag_base._M_i = false;
    }
  }
  return;
}

Assistant:

void setWithoutBothLock(const Reference& ref) const {
		chatra_assert(node != nullptr && ref.node != nullptr);
		switch (ref.node->type) {
		case ReferenceValueType::Bool:  node->setBool(ref.node->vBool); break;
		case ReferenceValueType::Int:  node->setInt(ref.node->vInt); break;
		case ReferenceValueType::Float:  node->setFloat(ref.node->vFloat); break;
		case ReferenceValueType::Object:  node->setObject(ref.node->object); break;
		}
	}